

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O3

LispPTR * N_OP_dunbind(LispPTR *stack_pointer,LispPTR tos)

{
  LispPTR *pLVar1;
  ulong uVar2;
  
  while (-1 < (int)tos) {
    pLVar1 = stack_pointer + -1;
    stack_pointer = stack_pointer + -1;
    tos = *pLVar1;
  }
  if (tos < 0xffff0000) {
    uVar2 = (ulong)((~tos >> 0x10) - 1);
    memset(MachineState.pvar + uVar2 * -2 + (ulong)(tos & 0xffff),0xff,uVar2 * 4 + 4);
  }
  return stack_pointer;
}

Assistant:

LispPTR *N_OP_dunbind(LispPTR *stack_pointer, LispPTR tos) {
  DLword num;     /* number of unbind sot */
  LispPTR *ppvar; /* pointer to last PVAR slot. */
  DLword i;       /* temporary for control */
  LispPTR value;

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_dunbind()\n");
#endif

  if (tos & 0x80000000) {
    /* check MSB bit of High word in tos, 1: unbound, 0: bound */

    /* tos is unbound */
    num = ~(GetHiWord(tos));
    value = 0xffffffff;
    if (num != 0) {
      ppvar = (LispPTR *)(PVar + 2 + GetLoWord(tos));
      for (i = 0; i < num; ++i) { *--ppvar = value; }
    }
  } else {
    /* tos is bound */
    /* now, stack_pointer points the latter part in slot */
    for (; !((*--stack_pointer) & 0x80000000);)
      ;
    /* scan (until MSB == 1) */

    value = *stack_pointer;
    num = ~(GetHiWord(value));
    ppvar = (LispPTR *)(PVar + 2 + GetLoWord(value));
    value = 0xffffffff;
    for (i = 0; i < num; i++) { *--ppvar = value; }
  }

  return (stack_pointer);
}